

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnLocalTee(SharedValidator *this,Location *loc,Var *param_2)

{
  Result rhs;
  Var local_78;
  Enum local_30;
  Type local_2c;
  Var *pVStack_28;
  Type type;
  Var *local_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  pVStack_28 = param_2;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  Type::Type(&local_2c,Any);
  this->expr_loc_ = loc;
  Var::Var(&local_78,param_2);
  local_30 = (Enum)CheckLocalIndex(this,&local_78,&local_2c);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_30);
  Var::~Var(&local_78);
  rhs = TypeChecker::OnLocalTee(&this->typechecker_,local_2c);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnLocalTee(const Location& loc, Var local_var) {
  Result result = Result::Ok;
  Type type = Type::Any;
  expr_loc_ = &loc;
  result |= CheckLocalIndex(local_var, &type);
  result |= typechecker_.OnLocalTee(type);
  return result;
}